

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFunctionRotation_SQUAD.cpp
# Opt level: O2

void __thiscall
chrono::ChFunctionRotation_SQUAD::ChFunctionRotation_SQUAD
          (ChFunctionRotation_SQUAD *this,ChFunctionRotation_SQUAD *other)

{
  (this->super_ChFunctionRotation)._vptr_ChFunctionRotation =
       (_func_int **)&PTR__ChFunctionRotation_SQUAD_01192f28;
  (this->space_fx).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->space_fx).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->knots).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
  this->rotations =
       (vector<chrono::ChQuaternion<double>,_std::allocator<chrono::ChQuaternion<double>_>_>)
       SUB3224(ZEXT432(0) << 0x40,0);
  (this->knots).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)SUB328(ZEXT432(0) << 0x40,0x18);
  std::vector<chrono::ChQuaternion<double>,_std::allocator<chrono::ChQuaternion<double>_>_>::
  operator=(&this->rotations,&other->rotations);
  this->p = other->p;
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Matrix<double,_1,1,0,_1,1>>
            (&this->knots,&other->knots);
  std::__shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->space_fx).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>,
             &(other->space_fx).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>);
  this->closed = other->closed;
  return;
}

Assistant:

ChFunctionRotation_SQUAD::ChFunctionRotation_SQUAD(const ChFunctionRotation_SQUAD& other) {
		this->rotations = other.rotations;
		this->p = other.p;
		this->knots = other.knots;
		this->space_fx = other.space_fx;
		this->closed = other.closed;
	}